

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.h
# Opt level: O1

void __thiscall
TPZMatrixSolver<std::complex<float>_>::SetReferenceMatrix
          (TPZMatrixSolver<std::complex<float>_> *this,TPZAutoPointer<TPZBaseMatrix> *matrix)

{
  TPZAutoPointer<TPZBaseMatrix> TStack_18;
  TPZAutoPointer<TPZBaseMatrix> local_10;
  
  local_10 = (TPZAutoPointer<TPZBaseMatrix>)matrix->fRef;
  LOCK();
  ((local_10.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_10.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZAutoPointerDynamicCast<TPZMatrix<std::complex<float>>,TPZBaseMatrix>(&TStack_18);
  TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::operator=
            (&this->fReferenceMatrix,(TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *)&TStack_18)
  ;
  TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *)&TStack_18);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(&local_10);
  return;
}

Assistant:

virtual void SetReferenceMatrix(TPZAutoPointer<TPZBaseMatrix> matrix)
	{
		fReferenceMatrix = TPZAutoPointerDynamicCast<TPZMatrix<TVar>>(matrix);
	}